

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDropSat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Abc_Ntk_t *pAVar6;
  char *pcVar7;
  uint local_44;
  int fVerbose;
  int c;
  int fNoSweep;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar6 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  local_44 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"svh");
    if (iVar2 == -1) {
      if (pAVar6 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar2 = Abc_NtkIsStrash(pAVar6);
        if (iVar2 == 0) {
          Abc_Print(-1,"This command works only for AIGs (run \"strash\").\n");
          pAbc_local._4_4_ = 1;
        }
        else if (pAbc->vCexVec == (Vec_Ptr_t *)0x0) {
          Abc_Print(-1,"CEX array is not defined. Run \"bmc3 -az\", \"sim3 -az\", or \"pdr -az\".\n"
                   );
          pAbc_local._4_4_ = 1;
        }
        else {
          iVar2 = Vec_PtrSize(pAbc->vCexVec);
          iVar3 = Abc_NtkPoNum(pAVar6);
          if (iVar2 == iVar3) {
            Abc_NtkDropSatOutputs(pAVar6,pAbc->vCexVec,local_44);
            if (!bVar1) {
              pAVar6 = Abc_NtkDarLatchSweep(pAVar6,1,1,1,0,-1,-1,0,0);
              if (pAVar6 == (Abc_Ntk_t *)0x0) {
                Abc_Print(-1,"Removing SAT outputs has failed.\n");
                return 1;
              }
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar6);
            }
            pAbc_local._4_4_ = 0;
          }
          else {
            uVar4 = Vec_PtrSize(pAbc->vCexVec);
            uVar5 = Abc_NtkPoNum(pAVar6);
            Abc_Print(-1,"CEX array size (%d) does not match the number of outputs (%d).\n",
                      (ulong)uVar4,(ulong)uVar5);
            pAbc_local._4_4_ = 1;
          }
        }
      }
      return pAbc_local._4_4_;
    }
    if (iVar2 == 0x68) break;
    if (iVar2 == 0x73) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if (iVar2 != 0x76) break;
      local_44 = local_44 ^ 1;
    }
  }
  Abc_Print(-2,"usage: dropsat [-sh]\n");
  Abc_Print(-2,"\t         replaces satisfiable POs by constant 0 and cleans up the AIG\n");
  pcVar7 = "no";
  if (bVar1) {
    pcVar7 = "yes";
  }
  Abc_Print(-2,"\t-s     : toggles skipping sequential sweep [default = %s]\n",pcVar7);
  pcVar7 = "no";
  if (local_44 != 0) {
    pcVar7 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar7);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandDropSat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDropSatOutputs( Abc_Ntk_t * pNtk, Vec_Ptr_t * vCexes, int fVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc), * pNtkRes = NULL;
    int fNoSweep = 0;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fNoSweep ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for AIGs (run \"strash\").\n" );
        return 1;
    }
    if ( pAbc->vCexVec == NULL )
    {
        Abc_Print( -1, "CEX array is not defined. Run \"bmc3 -az\", \"sim3 -az\", or \"pdr -az\".\n" );
        return 1;
    }
    if ( Vec_PtrSize(pAbc->vCexVec) != Abc_NtkPoNum(pNtk) )
    {
        Abc_Print( -1, "CEX array size (%d) does not match the number of outputs (%d).\n", Vec_PtrSize(pAbc->vCexVec), Abc_NtkPoNum(pNtk) );
        return 1;
    }
    Abc_NtkDropSatOutputs( pNtk, pAbc->vCexVec, fVerbose );
    if ( !fNoSweep )
    {
        pNtkRes = Abc_NtkDarLatchSweep( pNtk, 1, 1, 1, 0, -1, -1, 0, 0 );
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "Removing SAT outputs has failed.\n" );
            return 1;
        }
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: dropsat [-sh]\n" );
    Abc_Print( -2, "\t         replaces satisfiable POs by constant 0 and cleans up the AIG\n" );
    Abc_Print( -2, "\t-s     : toggles skipping sequential sweep [default = %s]\n", fNoSweep? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}